

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testVec.cpp
# Opt level: O0

void anon_unknown.dwarf_97a80::testLength2T<float>(void)

{
  bool bVar1;
  float fVar2;
  float fVar3;
  double dVar4;
  undefined1 auVar5 [16];
  float t;
  Vec2<float> v;
  float e;
  float s;
  float in_stack_ffffffffffffff0c;
  float in_stack_ffffffffffffff10;
  float in_stack_ffffffffffffff14;
  float a;
  undefined4 in_stack_ffffffffffffff18;
  undefined4 in_stack_ffffffffffffff1c;
  float fVar6;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  Vec2<float> local_cc [2];
  Vec2<float> local_bc [2];
  Vec2<float> local_ac [2];
  Vec2<float> local_9c [2];
  Vec2<float> local_8c [2];
  Vec2<float> local_7c [2];
  Vec2<float> local_6c [2];
  Vec2<float> local_5c [2];
  Vec2<float> local_4c;
  float local_44;
  Vec2<float> local_38 [2];
  Vec2<float> local_28 [2];
  Vec2<float> local_18;
  Vec2<float> local_10;
  float local_8;
  float local_4;
  undefined1 extraout_var [12];
  
  auVar5._0_4_ = Imath_2_5::limits<float>::smallest();
  auVar5._4_12_ = extraout_var;
  dVar4 = Imath_2_5::Math<float>::sqrt(auVar5._0_8_);
  local_4 = SUB84(dVar4,0);
  local_8 = Imath_2_5::limits<float>::epsilon();
  local_8 = local_8 * 4.0;
  Imath_2_5::Vec2<float>::Vec2(&local_10);
  Imath_2_5::Vec2<float>::Vec2(&local_18,0.0,0.0);
  Imath_2_5::Vec2<float>::operator=(&local_10,&local_18);
  fVar2 = Imath_2_5::Vec2<float>::length
                    ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __assert_fail("v.length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x3f,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  fVar2 = Imath_2_5::Vec2<float>::length
                    ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if ((fVar2 != 0.0) || (NAN(fVar2))) {
    __assert_fail("v.normalized().length() == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x40,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_28,3.0,4.0);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_28);
  fVar2 = Imath_2_5::Vec2<float>::length
                    ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if ((fVar2 != 5.0) || (NAN(fVar2))) {
    __assert_fail("v.length() == 5",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x43,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x44,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_38,3000.0,4000.0);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_38);
  fVar2 = Imath_2_5::Vec2<float>::length
                    ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  if ((fVar2 != 5000.0) || (NAN(fVar2))) {
    __assert_fail("v.length() == 5000",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x47,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x48,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  local_44 = local_4 * 16.0;
  Imath_2_5::Vec2<float>::Vec2(&local_4c,local_44,0.0);
  Imath_2_5::Vec2<float>::operator=(&local_10,&local_4c);
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x4d,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x4e,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_5c,0.0,local_44);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_5c);
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x50,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x51,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_6c,-local_44,-local_44);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_6c);
  fVar2 = Imath_2_5::Vec2<float>::length
                    ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  Imath_2_5::Math<float>::sqrt(5.30498947741318e-315);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (2), t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x53,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x54,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  local_44 = local_4 / 16.0;
  Imath_2_5::Vec2<float>::Vec2(local_7c,local_44,0.0);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_7c);
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x59,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x5a,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_8c,0.0,local_44);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_8c);
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x5c,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x5d,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_9c,-local_44,-local_44);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_9c);
  Imath_2_5::Vec2<float>::length
            ((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff1c,in_stack_ffffffffffffff18));
  fVar6 = local_44;
  Imath_2_5::Math<float>::sqrt(5.30498947741318e-315);
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (2), t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x5f,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x60,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  local_44 = local_4 / 1048576.0;
  Imath_2_5::Vec2<float>::Vec2(local_ac,local_44,0.0);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_ac);
  Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x65,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x66,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_bc,0.0,local_44);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_bc);
  Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,float,float>
                    (in_stack_ffffffffffffff14,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x68,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff18));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (in_stack_ffffffffffffff14,(int)in_stack_ffffffffffffff10,
                     in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x69,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::Vec2(local_cc,-local_44,-local_44);
  Imath_2_5::Vec2<float>::operator=(&local_10,local_cc);
  fVar3 = Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,in_stack_ffffffffffffff18));
  a = local_44;
  Imath_2_5::Math<float>::sqrt(5.30498947741318e-315);
  bVar1 = Imath_2_5::equal<float,float,float>(a,in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c)
  ;
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (2), t * e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x6b,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  Imath_2_5::Vec2<float>::normalized((Vec2<float> *)CONCAT44(in_stack_ffffffffffffff2c,fVar2));
  Imath_2_5::Vec2<float>::length((Vec2<float> *)CONCAT44(fVar6,fVar3));
  bVar1 = Imath_2_5::equal<float,int,float>
                    (a,(int)in_stack_ffffffffffffff10,in_stack_ffffffffffffff0c);
  if (!bVar1) {
    __assert_fail("IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/ext/openexr/IlmBase/ImathTest/testVec.cpp"
                  ,0x6c,"void (anonymous namespace)::testLength2T() [T = float]");
  }
  return;
}

Assistant:

void
testLength2T ()
{
    const T s = Math<T>::sqrt (limits<T>::smallest());
    const T e = 4 * limits<T>::epsilon();

    Vec2<T> v;

    v = Vec2<T> (0, 0);
    assert (v.length() == 0);
    assert (v.normalized().length() == 0);

    v = Vec2<T> (3, 4);
    assert (v.length() == 5);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    v = Vec2<T> (3000, 4000);
    assert (v.length() == 5000);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    T t = s * (1 << 4);

    v = Vec2<T> (t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec2<T> (0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec2<T> (-t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (2), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 4);

    v = Vec2<T> (t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec2<T> (0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec2<T> (-t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (2), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));

    t = s / (1 << 20);

    v = Vec2<T> (t, 0);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec2<T> (0, t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t, t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
    v = Vec2<T> (-t, -t);
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.length(), t * Math<T>::sqrt (2), t * e));
    assert (IMATH_INTERNAL_NAMESPACE::equal (v.normalized().length(), 1, e));
}